

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

wasm_memory_t * wasm_memory_new(wasm_store_t *store,wasm_memorytype_t *type)

{
  wasm_memory_t *this;
  MemoryType *pMVar1;
  Ptr PStack_58;
  MemoryType local_40;
  
  fprintf(_stderr,"CAPI: [%s] \n","wasm_memory_new");
  this = (wasm_memory_t *)operator_new(0x18);
  pMVar1 = wasm_externtype_t::As<wabt::interp::MemoryType>(&type->super_wasm_externtype_t);
  local_40.super_ExternType.kind = (pMVar1->super_ExternType).kind;
  local_40.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_001f0920;
  local_40.limits.has_max = (pMVar1->limits).has_max;
  local_40.limits.is_shared = (pMVar1->limits).is_shared;
  local_40.limits._18_6_ = *(undefined6 *)&(pMVar1->limits).field_0x12;
  local_40.limits.initial = (pMVar1->limits).initial;
  local_40.limits.max = (pMVar1->limits).max;
  wabt::interp::Memory::New(&PStack_58,&store->I,&local_40);
  wasm_memory_t::wasm_memory_t(this,&PStack_58);
  wabt::interp::RefPtr<wabt::interp::Memory>::reset(&PStack_58);
  return this;
}

Assistant:

own wasm_memory_t* wasm_memory_new(wasm_store_t* store,
                                   const wasm_memorytype_t* type) {
  TRACE0();
  return new wasm_memory_t{Memory::New(store->I, *type->As<MemoryType>())};
}